

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

String __thiscall doctest::String::operator+(String *this,String *other)

{
  String *other_00;
  String *in_RDX;
  String local_28 [2];
  String *other_local;
  String *this_local;
  
  other_local = other;
  this_local = this;
  String(local_28,other->m_str);
  other_00 = operator+=(local_28,in_RDX);
  String(this,other_00);
  ~String(local_28);
  return (String)(char *)this;
}

Assistant:

String String::operator+(const String& other) const { return String(m_str) += other; }